

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>
          (QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,QNetworkReply **key,
          CallerInfo *args)

{
  Data *pDVar1;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var2;
  piter pVar3;
  Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>>::
  findOrInsert<QNetworkReply*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>> **)
              this,key);
  this_00 = (Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    *(QNetworkReply **)this_00 = *key;
    pDVar1 = (args->contextObject).wp.d;
    *(Data **)(this_00 + 8) = pDVar1;
    *(QObject **)(this_00 + 0x10) = (args->contextObject).wp.value;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _Var2._M_head_impl =
         (args->slot).obj._M_t.
         super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t
         .super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
         super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (QSlotObjectBase *)0x0) {
      LOCK();
      (_Var2._M_head_impl)->m_ref = (QAtomicInt)(*(int *)&(_Var2._M_head_impl)->m_ref + 1);
      UNLOCK();
    }
    *(QSlotObjectBase **)(this_00 + 0x18) =
         (args->slot).obj._M_t.
         super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t
         .super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
         super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  }
  else {
    QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
    emplaceValue<QRestAccessManagerPrivate::CallerInfo_const&>(this_00,args);
  }
  pVar3.bucket = local_38._8_8_;
  pVar3.d = (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }